

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::compiler::Expression::Builder::initImport(Builder *__return_storage_ptr__,Builder *this)

{
  uint uVar1;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Expression::Which>
            (&this->_builder,uVar1,IMPORT);
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerHelpers<capnp::compiler::LocatedText,_(capnp::Kind)3>::init
            ((EVP_PKEY_CTX *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::compiler::LocatedText::Builder Expression::Builder::initImport() {
  _builder.setDataField<Expression::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Expression::IMPORT);
  return ::capnp::_::PointerHelpers< ::capnp::compiler::LocatedText>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
}